

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDateTime QDateTime::fromString(QStringView string,DateFormat format)

{
  QStringView *pQVar1;
  undefined1 *puVar2;
  undefined1 **ppuVar3;
  bool bVar4;
  int iVar5;
  QTime QVar6;
  Data date;
  qsizetype qVar7;
  qlonglong qVar8;
  qlonglong qVar9;
  DateFormat in_ECX;
  uint uVar10;
  ulong uVar11;
  undefined4 in_register_00000014;
  storage_type_conflict *psVar12;
  int iVar13;
  storage_type_conflict *psVar14;
  storage_type_conflict *psVar15;
  Data DVar16;
  Data d;
  Data *this;
  int y;
  storage_type_conflict *psVar18;
  byte bVar19;
  int iVar20;
  long lVar21;
  long in_FS_OFFSET;
  QStringView string_00;
  QStringView string_01;
  QStringView needle;
  QStringView needle_00;
  QLatin1StringView needle_01;
  QLatin1StringView needle_02;
  ParsedRfcDateTime PVar22;
  QStringView string_02;
  QStringView QVar23;
  QStringView haystack;
  QStringView haystack_00;
  QStringView offsetString;
  QStringView string_03;
  QStringView string_04;
  QStringView offsetString_00;
  QStringView needle0;
  QStringView needle0_00;
  bool isMidnight24;
  bool ok_1;
  iterator it;
  Data local_120;
  QDate local_118;
  bool local_109;
  Data local_108;
  Data DStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  Data local_d0;
  storage_type_conflict *local_c8;
  storage_type_conflict *local_c0;
  undefined8 local_b8;
  Data local_b0;
  long local_a8;
  undefined1 **local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  QDate *pQVar17;
  
  psVar12 = (storage_type_conflict *)CONCAT44(in_register_00000014,format);
  psVar14 = string.m_data;
  d = (Data)string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (psVar14 == (storage_type_conflict *)0x0) goto switchD_0034b42f_caseD_2;
  switch(in_ECX) {
  case TextDate:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = (Data)0x6;
    local_a8 = 0;
    local_d0.d = (QTimeZonePrivate *)0x100000001;
    local_b8 = 0xaaaaaaaaaaaa0020;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    DStack_100.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8 = psVar14;
    local_c0 = psVar12;
    local_a0 = &local_98;
    QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
              ((iterator *)&local_108.s,(QStringTokenizerBase<QStringView,_QChar> *)&local_d0.s);
    iVar13 = 6;
    do {
      if ((char)puStack_f0 == '\0') break;
      QVLABase<QStringView>::emplace_back_impl<QStringView_const&>
                ((QVLABase<QStringView> *)&local_b0.s,6,&local_98,(QStringView *)&DStack_100.s);
      QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)&local_108.s);
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    ppuVar3 = local_a0;
    if ((local_a8 < 5) || ((char)puStack_f0 == '\x01')) {
LAB_0034b56a:
      QDateTime((QDateTime *)d.d);
    }
    else {
      pQVar17 = &local_118;
      local_118.jd._0_2_ = 0x3a;
      needle0.m_data = (storage_type_conflict *)pQVar17;
      needle0.m_size = 1;
      qVar7 = QtPrivate::findString(*(QStringView *)(local_a0 + 6),0,needle0,CaseSensitive);
      iVar13 = (int)pQVar17;
      if (qVar7 == -1) {
        pQVar17 = &local_118;
        local_118.jd._0_2_ = 0x3a;
        needle0_00.m_data = (storage_type_conflict *)pQVar17;
        needle0_00.m_size = 1;
        qVar7 = QtPrivate::findString(*(QStringView *)(ppuVar3 + 8),0,needle0_00,CaseSensitive);
        iVar13 = (int)pQVar17;
        if (qVar7 == -1) goto LAB_0034b56a;
        iVar20 = 3;
        iVar5 = 4;
      }
      else {
        iVar20 = 4;
        iVar5 = 3;
      }
      local_109 = false;
      string_00.m_data = (storage_type_conflict *)&local_109;
      string_00.m_size = (qsizetype)ppuVar3[5];
      qVar8 = QString::toIntegral_helper((QString *)ppuVar3[4],string_00,(bool *)0xa,iVar13);
      if ((int)qVar8 == qVar8) {
        y = 0;
        if ((local_109 & 1U) == 0) {
          bVar19 = 1;
        }
        else {
          string_01.m_data = (storage_type_conflict *)&local_109;
          string_01.m_size = *(qsizetype *)((long)local_a0 + (ulong)(uint)(iVar20 << 4) + 8);
          qVar9 = QString::toIntegral_helper
                            (*(QString **)((long)local_a0 + (ulong)(uint)(iVar20 << 4)),string_01,
                             (bool *)0xa,iVar13);
          bVar19 = 1;
          if ((int)qVar9 == qVar9) {
            bVar19 = local_109 ^ 1;
            y = (int)qVar9;
          }
          else {
            local_109 = false;
          }
        }
      }
      else {
        local_109 = false;
        bVar19 = 1;
        qVar8 = 0;
        y = 0;
      }
      iVar13 = fromShortMonthName(*(QStringView *)(local_a0 + 2));
      if ((((iVar13 < 1) || (qVar8 == 0)) || (y == 0)) || ((bVar19 & 1) != 0)) goto LAB_0034b56a;
      local_118.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      QDate::QDate(&local_118,y,iVar13,(int)qVar8);
      if (((undefined1 *)0x16d3e147973 < (undefined1 *)(local_118.jd + 0xb69eeff91f)) ||
         (string_04.m_data =
               *(storage_type_conflict **)((long)local_a0 + (ulong)(uint)(iVar5 << 4) + 8),
         string_04.m_size = *(qsizetype *)((long)local_a0 + (ulong)(uint)(iVar5 << 4)),
         QVar6 = fromIsoTimeString(string_04,TextDate,(bool *)0x0), 86399999 < (uint)QVar6.mds))
      goto LAB_0034b56a;
      if (local_a8 == 5) {
        QDateTime((QDateTime *)d.d,local_118,QVar6,LegacyBehavior);
      }
      else {
        pQVar1 = (QStringView *)(local_a0 + 10);
        lVar21 = pQVar1->m_size;
        puVar2 = local_a0[0xb];
        QVar23 = *pQVar1;
        needle_01.m_data = "UTC";
        needle_01.m_size = 3;
        bVar4 = QtPrivate::startsWith(*pQVar1,needle_01,CaseSensitive);
        if ((!bVar4) &&
           (needle_02.m_data = "GMT", needle_02.m_size = 3,
           bVar4 = QtPrivate::startsWith(QVar23,needle_02,CaseInsensitive), !bVar4))
        goto LAB_0034b56a;
        lVar21 = lVar21 + -3;
        if (lVar21 == 0) {
          local_120 = (Data)0x2;
          QDateTime((QDateTime *)d.d,local_118,QVar6,(QTimeZone *)&local_120.s,LegacyBehavior);
        }
        else {
          offsetString_00.m_data = (storage_type_conflict *)(puVar2 + 6);
          offsetString_00.m_size = lVar21;
          iVar13 = fromOffsetString(offsetString_00,&local_109);
          if (local_109 != true) goto LAB_0034b56a;
          local_120.d = (QTimeZonePrivate *)0x0;
          if ((long)iVar13 + 0xe100U < 0x1c201) {
            local_120.d = (QTimeZonePrivate *)((3 - (ulong)(iVar13 == 0)) + (long)iVar13 * 4);
          }
          QDateTime((QDateTime *)d.d,local_118,QVar6,(QTimeZone *)&local_120.s,LegacyBehavior);
        }
        QTimeZone::~QTimeZone((QTimeZone *)&local_120.s);
      }
    }
    if (local_a0 != &local_98) {
      QtPrivate::sizedFree(local_a0,(long)local_b0.d << 4);
    }
    break;
  case ISODate:
  case ISODateWithMs:
    iVar13 = (int)string.m_data;
    if (iVar13 < 10) goto switchD_0034b42f_caseD_2;
    string_02.m_data = psVar12;
    string_02.m_size = 10;
    date.s = (ShortData)QDate::fromString(string_02,ISODate);
    local_b0.s = date.s;
    if ((undefined1 *)((long)&date.d[0x490c5ffd3].m_id.d.size + 7U) < (undefined1 *)0x16d3e147974) {
      if (iVar13 != 10) {
        local_108 = (Data)0x1;
        if ((long)psVar14 < 0xc) {
LAB_0034b93b:
          QDateTime((QDateTime *)d.d);
        }
        else {
          local_d0._0_2_ = 0x54;
          needle.m_data = (storage_type_conflict *)&local_d0;
          needle.m_size = 1;
          haystack.m_data = psVar12 + 10;
          haystack.m_size = (qsizetype)(psVar14 + -5);
          bVar4 = QtPrivate::startsWith(haystack,needle,CaseInsensitive);
          if ((!bVar4) && (psVar12[10] != L' ')) goto LAB_0034b93b;
          psVar18 = (storage_type_conflict *)((long)psVar14 - 0xb);
          local_d0._0_2_ = 0x5a;
          needle_00.m_data = (storage_type_conflict *)&local_d0;
          needle_00.m_size = 1;
          haystack_00.m_data = psVar12 + 0xb;
          haystack_00.m_size = (qsizetype)psVar18;
          bVar4 = QtPrivate::endsWith(haystack_00,needle_00,CaseInsensitive);
          if (bVar4) {
            local_108 = (Data)0x2;
            local_d0 = (Data)0x1;
            QTimeZone::~QTimeZone((QTimeZone *)&local_d0.s);
            psVar18 = psVar14 + -6;
          }
          else {
            psVar15 = psVar12 + (long)(iVar13 + -0xc) + 0xb;
            lVar21 = 0;
            uVar11 = (ulong)psVar18 & 0xffffffff;
            do {
              if ((*psVar15 == L'+') || (*psVar15 == L'-')) {
                local_118.jd._0_1_ = 0xaa;
                offsetString.m_size = (long)psVar14 + (-lVar21 - (long)(iVar13 + -0xc)) + -0xb;
                offsetString.m_data = psVar15;
                iVar5 = fromOffsetString(offsetString,(bool *)&local_118);
                if ((char)local_118.jd != '\x01') goto LAB_0034b93b;
                psVar18 = (storage_type_conflict *)((iVar13 + -0xc) + lVar21);
                DVar16.d = (QTimeZonePrivate *)0x0;
                if ((long)iVar5 + 0xe100U < 0x1c201) {
                  DVar16.d = (QTimeZonePrivate *)((3 - (ulong)(iVar5 == 0)) + (long)iVar5 * 4);
                }
                local_d0 = local_108;
                local_108 = DVar16;
                QTimeZone::~QTimeZone((QTimeZone *)&local_d0.s);
                break;
              }
              uVar10 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar10;
              psVar15 = psVar15 + -1;
              lVar21 = lVar21 + -1;
            } while (0 < (int)uVar10);
          }
          local_118.jd = local_118.jd & 0xffffffffffffff00;
          string_03.m_data = psVar12 + 0xb;
          string_03.m_size = (qsizetype)psVar18;
          QVar6 = fromIsoTimeString(string_03,in_ECX,(bool *)&local_118);
          if (86399999 < (uint)QVar6.mds) goto LAB_0034b93b;
          if ((char)local_118.jd == '\x01') {
            local_d0 = (Data)0x8000000000000000;
            if ((undefined1 *)0xfffffe92c1eb868c <
                (undefined1 *)((long)&date.d[-0x490c75003].m_id.d.size + 4U)) {
              local_d0.d = (QTimeZonePrivate *)((long)&(date.d)->_vptr_QTimeZonePrivate + 1);
            }
            QDate::startOfDay((QDate *)d.d,(QTimeZone *)&local_d0.s);
          }
          else {
            QDateTime((QDateTime *)d.d,(QDate)date.s,QVar6,(QTimeZone *)&local_108.s,LegacyBehavior)
            ;
          }
        }
        this = &local_108;
        goto LAB_0034b948;
      }
      QDate::startOfDay((QDate *)d.d);
    }
    else {
      QDateTime((QDateTime *)d.d);
    }
    break;
  default:
    goto switchD_0034b42f_caseD_2;
  case RFC2822Date:
    QVar23.m_data = psVar12;
    QVar23.m_size = (qsizetype)psVar14;
    PVar22 = rfcDateImpl(QVar23);
    if ((PVar22.date.jd.jd + 0xb69eeff91fU < 0x16d3e147974) &&
       ((uint)PVar22.time.mds.mds < 86400000)) {
      *(undefined1 **)d.d = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = (Data)0x2;
      QDateTime((QDateTime *)d.d,PVar22.date.jd,PVar22.time.mds,(QTimeZone *)&local_b0.s,
                LegacyBehavior);
      QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
      lVar21 = (long)PVar22._8_8_ >> 0x20;
      local_b0.d = (QTimeZonePrivate *)0x0;
      if (lVar21 + 0xe100U < 0x1c201) {
        local_b0.d = (QTimeZonePrivate *)((3 - (ulong)(PVar22._8_8_ >> 0x20 == 0)) + lVar21 * 4);
      }
      reviseTimeZone((QDateTimeData *)d.d,(QTimeZone *)&local_b0.s,LegacyBehavior);
      this = &local_b0;
LAB_0034b948:
      QTimeZone::~QTimeZone((QTimeZone *)&this->s);
      break;
    }
    goto switchD_0034b42f_caseD_2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)d;
  }
LAB_0034bc03:
  __stack_chk_fail();
switchD_0034b42f_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QDateTime((QDateTime *)d.d);
    return (QDateTime)(QDateTimePrivate *)d;
  }
  goto LAB_0034bc03;
}

Assistant:

QDateTime QDateTime::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDateTime();

    switch (format) {
    case Qt::RFC2822Date: {
        const ParsedRfcDateTime rfc = rfcDateImpl(string);

        if (!rfc.date.isValid() || !rfc.time.isValid())
            return QDateTime();

        QDateTime dateTime(rfc.date, rfc.time, QTimeZone::UTC);
        dateTime.setTimeZone(QTimeZone::fromSecondsAheadOfUtc(rfc.utcOffset));
        return dateTime;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const int size = string.size();
        if (size < 10)
            return QDateTime();

        QDate date = QDate::fromString(string.first(10), Qt::ISODate);
        if (!date.isValid())
            return QDateTime();
        if (size == 10)
            return date.startOfDay();

        QTimeZone zone = QTimeZone::LocalTime;
        QStringView isoString = string.sliced(10); // trim "yyyy-MM-dd"

        // Must be left with T (or space) and at least one digit for the hour:
        if (isoString.size() < 2
            || !(isoString.startsWith(u'T', Qt::CaseInsensitive)
                 // RFC 3339 (section 5.6) allows a space here.  (It actually
                 // allows any separator one considers more readable, merely
                 // giving space as an example - but let's not go wild !)
                 || isoString.startsWith(u' '))) {
            return QDateTime();
        }
        isoString = isoString.sliced(1); // trim 'T' (or space)

        // Check end of string for Time Zone definition, either Z for UTC or ±HH:mm for Offset
        if (isoString.endsWith(u'Z', Qt::CaseInsensitive)) {
            zone = QTimeZone::UTC;
            isoString.chop(1); // trim 'Z'
        } else {
            // the loop below is faster but functionally equal to:
            // const int signIndex = isoString.indexOf(QRegulargExpression(QStringLiteral("[+-]")));
            int signIndex = isoString.size() - 1;
            Q_ASSERT(signIndex >= 0);
            bool found = false;
            do {
                QChar character(isoString[signIndex]);
                found = character == u'+' || character == u'-';
            } while (!found && --signIndex >= 0);

            if (found) {
                bool ok;
                int offset = fromOffsetString(isoString.sliced(signIndex), &ok);
                if (!ok)
                    return QDateTime();
                isoString = isoString.first(signIndex);
                zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            }
        }

        // Might be end of day (24:00, including variants), which QTime considers invalid.
        // ISO 8601 (section 4.2.3) says that 24:00 is equivalent to 00:00 the next day.
        bool isMidnight24 = false;
        QTime time = fromIsoTimeString(isoString, format, &isMidnight24);
        if (!time.isValid())
            return QDateTime();
        if (isMidnight24) // time is 0:0, but we want the start of next day:
            return date.addDays(1).startOfDay(zone);
        return QDateTime(date, time, zone);
    }
    case Qt::TextDate: {
        QVarLengthArray<QStringView, 6> parts;

        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        // Documented as "ddd MMM d HH:mm:ss yyyy" with optional offset-suffix;
        // and allow time either before or after year.
        if (parts.size() < 5 || it != tokens.end())
            return QDateTime();

        // Year and time can be in either order.
        // Guess which by looking for ':' in the time
        int yearPart = 3;
        int timePart = 3;
        if (parts.at(3).contains(u':'))
            yearPart = 4;
        else if (parts.at(4).contains(u':'))
            timePart = 4;
        else
            return QDateTime();

        bool ok = false;
        int day = parts.at(2).toInt(&ok);
        int year = ok ? parts.at(yearPart).toInt(&ok) : 0;
        int month = fromShortMonthName(parts.at(1));
        if (!ok || year == 0 || day == 0 || month < 1)
            return QDateTime();

        const QDate date(year, month, day);
        if (!date.isValid())
            return QDateTime();

        const QTime time = fromIsoTimeString(parts.at(timePart), format, nullptr);
        if (!time.isValid())
            return QDateTime();

        if (parts.size() == 5)
            return QDateTime(date, time);

        QStringView tz = parts.at(5);
        if (tz.startsWith("UTC"_L1)
            // GMT has long been deprecated as an alias for UTC.
            || tz.startsWith("GMT"_L1, Qt::CaseInsensitive)) {
            tz = tz.sliced(3);
            if (tz.isEmpty())
                return QDateTime(date, time, QTimeZone::UTC);

            int offset = fromOffsetString(tz, &ok);
            return ok ? QDateTime(date, time, QTimeZone::fromSecondsAheadOfUtc(offset))
                      : QDateTime();
        }
        return QDateTime();
    }
    }

    return QDateTime();
}